

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

Const * __thiscall wasm::Builder::makeConst(Builder *this,Literal *value)

{
  Const *pCVar1;
  
  if ((value->type).id - 2 < 5) {
    pCVar1 = MixedArena::alloc<wasm::Const>(&this->wasm->allocator);
    wasm::Literal::operator=(&pCVar1->value,value);
    (pCVar1->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id =
         (value->type).id;
    return pCVar1;
  }
  __assert_fail("value.type.isNumber()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                ,0x255,"Const *wasm::Builder::makeConst(Literal)");
}

Assistant:

Const* makeConst(Literal value) {
    assert(value.type.isNumber());
    auto* ret = wasm.allocator.alloc<Const>();
    ret->value = value;
    ret->type = value.type;
    return ret;
  }